

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O0

SyntaxToken * __thiscall
psy::C::SyntaxNode::findValidToken
          (SyntaxToken *__return_storage_ptr__,SyntaxNode *this,
          vector<psy::C::SyntaxHolder,_std::allocator<psy::C::SyntaxHolder>_> *syntaxHolders)

{
  bool bVar1;
  Variant VVar2;
  IndexType IVar3;
  IndexType IVar4;
  SyntaxNode *pSVar5;
  SyntaxNodeList *pSVar6;
  SyntaxToken local_d0;
  byte local_91;
  uint local_90;
  SyntaxToken local_80;
  byte local_41;
  SyntaxHolder *local_40;
  SyntaxHolder *holder;
  const_iterator __end1;
  const_iterator __begin1;
  vector<psy::C::SyntaxHolder,_std::allocator<psy::C::SyntaxHolder>_> *__range1;
  vector<psy::C::SyntaxHolder,_std::allocator<psy::C::SyntaxHolder>_> *syntaxHolders_local;
  SyntaxNode *this_local;
  SyntaxToken *tk;
  
  __end1 = std::vector<psy::C::SyntaxHolder,_std::allocator<psy::C::SyntaxHolder>_>::begin
                     (syntaxHolders);
  holder = (SyntaxHolder *)
           std::vector<psy::C::SyntaxHolder,_std::allocator<psy::C::SyntaxHolder>_>::end
                     (syntaxHolders);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_psy::C::SyntaxHolder_*,_std::vector<psy::C::SyntaxHolder,_std::allocator<psy::C::SyntaxHolder>_>_>
                                *)&holder);
    if (!bVar1) {
      SyntaxToken::SyntaxToken(__return_storage_ptr__,(SyntaxTree *)0x0);
      return __return_storage_ptr__;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<const_psy::C::SyntaxHolder_*,_std::vector<psy::C::SyntaxHolder,_std::allocator<psy::C::SyntaxHolder>_>_>
               ::operator*(&__end1);
    VVar2 = SyntaxHolder::variant(local_40);
    if (VVar2 == Token) {
      IVar3 = SyntaxHolder::tokenIndex(local_40);
      IVar4 = LexedTokens::invalidIndex();
      if (IVar3 != IVar4) {
        IVar3 = SyntaxHolder::tokenIndex(local_40);
        tokenAtIndex(__return_storage_ptr__,this,IVar3);
        return __return_storage_ptr__;
      }
    }
    else if (VVar2 == Node) {
      pSVar5 = SyntaxHolder::node(local_40);
      if (pSVar5 != (SyntaxNode *)0x0) {
        local_41 = 0;
        pSVar5 = SyntaxHolder::node(local_40);
        firstToken(__return_storage_ptr__,pSVar5);
        SyntaxToken::invalid();
        bVar1 = C::operator!=(__return_storage_ptr__,&local_80);
        SyntaxToken::~SyntaxToken(&local_80);
        if (bVar1) {
          local_41 = 1;
        }
        local_90 = (uint)bVar1;
        if ((local_41 & 1) == 0) {
          SyntaxToken::~SyntaxToken(__return_storage_ptr__);
        }
        goto joined_r0x003cfa81;
      }
    }
    else if ((VVar2 == NodeList) &&
            (pSVar6 = SyntaxHolder::nodeList(local_40), pSVar6 != (SyntaxNodeList *)0x0)) {
      local_91 = 0;
      pSVar6 = SyntaxHolder::nodeList(local_40);
      (**pSVar6->_vptr_SyntaxNodeList)(__return_storage_ptr__);
      SyntaxToken::invalid();
      bVar1 = C::operator!=(__return_storage_ptr__,&local_d0);
      SyntaxToken::~SyntaxToken(&local_d0);
      if (bVar1) {
        local_91 = 1;
      }
      local_90 = (uint)bVar1;
      if ((local_91 & 1) == 0) {
        SyntaxToken::~SyntaxToken(__return_storage_ptr__);
      }
joined_r0x003cfa81:
      if (local_90 != 0) {
        return __return_storage_ptr__;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_psy::C::SyntaxHolder_*,_std::vector<psy::C::SyntaxHolder,_std::allocator<psy::C::SyntaxHolder>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

SyntaxToken SyntaxNode::findValidToken(const std::vector<SyntaxHolder>& syntaxHolders) const
{
    for (const auto& holder : syntaxHolders) {
        switch (holder.variant()) {
            case SyntaxHolder::Variant::Token:
                if (holder.tokenIndex() != LexedTokens::invalidIndex())
                    return tokenAtIndex(holder.tokenIndex());
                break;

            case SyntaxHolder::Variant::Node:
                if (holder.node()) {
                    auto tk = holder.node()->firstToken();
                    if (tk != SyntaxToken::invalid())
                        return tk;
                }
                break;

            case SyntaxHolder::Variant::NodeList:
                if (holder.nodeList()) {
                    auto tk = holder.nodeList()->firstToken();
                    if (tk != SyntaxToken::invalid())
                        return tk;
                }
                break;
        }
    }
    return 0;
}